

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RangeTokenMap.cpp
# Opt level: O2

RangeToken * __thiscall
xercesc_4_0::RangeTokenMap::getRange(RangeTokenMap *this,XMLCh *keyword,bool complement)

{
  bool bVar1;
  int iVar2;
  RangeTokenElemMap *pRVar3;
  undefined4 extraout_var;
  RangeFactory *pRVar4;
  RangeToken *pRVar5;
  XMLMutexLock lockInit;
  XMLMutexLock local_30;
  
  bVar1 = RefHashTableOf<xercesc_4_0::RangeTokenElemMap,_xercesc_4_0::StringHasher>::containsKey
                    (this->fTokenRegistry,keyword);
  if (!bVar1) {
    return (RangeToken *)0x0;
  }
  pRVar3 = RefHashTableOf<xercesc_4_0::RangeTokenElemMap,_xercesc_4_0::StringHasher>::get
                     (this->fTokenRegistry,keyword);
  if ((&pRVar3->fRange)[complement] != (RangeToken *)0x0) {
    return (&pRVar3->fRange)[complement];
  }
  XMLMutexLock::XMLMutexLock(&local_30,&this->fMutex);
  pRVar5 = (&pRVar3->fRange)[complement];
  if (pRVar5 != (RangeToken *)0x0) goto LAB_0025457d;
  iVar2 = (*(this->fCategories->super_XSerializable)._vptr_XSerializable[10])
                    (this->fCategories,(ulong)pRVar3->fCategoryId);
  pRVar4 = RefHashTableOf<xercesc_4_0::RangeFactory,_xercesc_4_0::StringHasher>::get
                     (this->fRangeMap,(void *)CONCAT44(extraout_var,iVar2));
  if (pRVar4 != (RangeFactory *)0x0) {
    (*pRVar4->_vptr_RangeFactory[3])(pRVar4,this);
    pRVar5 = (&pRVar3->fRange)[complement];
    if (!complement || pRVar5 != (RangeToken *)0x0) goto LAB_0025457d;
    if (pRVar3->fRange != (RangeToken *)0x0) {
      pRVar5 = RangeToken::complementRanges
                         (pRVar3->fRange,this->fTokenFactory,this->fTokenRegistry->fMemoryManager);
      pRVar3->fNRange = pRVar5;
      goto LAB_0025457d;
    }
  }
  pRVar5 = (RangeToken *)0x0;
LAB_0025457d:
  XMLMutexLock::~XMLMutexLock(&local_30);
  return pRVar5;
}

Assistant:

RangeToken* RangeTokenMap::getRange(const XMLCh* const keyword,
                                    const bool complement) {

    if (!fTokenRegistry->containsKey(keyword))
        return 0;

    RangeTokenElemMap* elemMap = fTokenRegistry->get(keyword);
    RangeToken* rangeTok = elemMap->getRangeToken(complement);

    if (!rangeTok)
    {
        XMLMutexLock lockInit(&fMutex);

        // make sure that it was not created while we were locked
        rangeTok = elemMap->getRangeToken(complement);

        if (!rangeTok)
        {
            unsigned int categId = elemMap->getCategoryId();
            const XMLCh* categName = fCategories->getValueForId(categId);
            RangeFactory* rangeFactory = fRangeMap->get(categName);

            if (rangeFactory)
            {
                rangeFactory->buildRanges(this);
                rangeTok = elemMap->getRangeToken(complement);

                // see if we are complementing an existing range
                if (!rangeTok && complement)
                {
                    rangeTok = elemMap->getRangeToken();
                    if (rangeTok)
                    {
                        rangeTok = RangeToken::complementRanges(rangeTok, fTokenFactory, fTokenRegistry->getMemoryManager());
                        elemMap->setRangeToken(rangeTok , complement);
                    }
                }
            }
        }
    }

    return rangeTok;
}